

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O2

string * __thiscall
cfd::js::api::json::
ExecuteElementsCheckApi<cfd::js::api::json::VerifySignRequest,cfd::js::api::json::VerifySignResponse,cfd::js::api::VerifySignRequestStruct,cfd::js::api::VerifySignResponseStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&)>
          *bitcoin_function,
          function<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&)>
          *elements_function)

{
  string sStack_2c8;
  VerifySignResponseStruct response;
  VerifySignResponse res;
  VerifySignRequestStruct request;
  VerifySignRequest req;
  
  VerifySignRequest::VerifySignRequest(&req);
  core::JsonClassBase<cfd::js::api::json::VerifySignRequest>::Deserialize
            (&req.super_JsonClassBase<cfd::js::api::json::VerifySignRequest>,(string *)this);
  VerifySignRequest::ConvertToStruct(&request,&req);
  VerifySignResponseStruct::VerifySignResponseStruct(&response);
  if (request.is_elements == true) {
    std::
    function<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&)>
    ::operator()((VerifySignResponseStruct *)&res,bitcoin_function,&request);
  }
  else {
    std::
    function<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&)>
    ::operator()((VerifySignResponseStruct *)&res,
                 (function<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&)>
                  *)request_message,&request);
  }
  VerifySignResponseStruct::operator=(&response,(VerifySignResponseStruct *)&res);
  VerifySignResponseStruct::~VerifySignResponseStruct((VerifySignResponseStruct *)&res);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (response.error.code == 0) {
    VerifySignResponse::VerifySignResponse(&res);
    VerifySignResponse::ConvertFromStruct(&res,&response);
    core::JsonClassBase<cfd::js::api::json::VerifySignResponse>::Serialize_abi_cxx11_
              (&sStack_2c8,&res.super_JsonClassBase<cfd::js::api::json::VerifySignResponse>);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_2c8);
    std::__cxx11::string::~string((string *)&sStack_2c8);
    VerifySignResponse::~VerifySignResponse(&res);
  }
  else {
    ErrorResponse::ConvertFromStruct((ErrorResponse *)&res,&response.error);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
              (&sStack_2c8,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)&res);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_2c8);
    std::__cxx11::string::~string((string *)&sStack_2c8);
    ErrorResponseBase::~ErrorResponseBase((ErrorResponseBase *)&res);
  }
  VerifySignResponseStruct::~VerifySignResponseStruct(&response);
  VerifySignRequestStruct::~VerifySignRequestStruct(&request);
  VerifySignRequest::~VerifySignRequest(&req);
  return __return_storage_ptr__;
}

Assistant:

std::string ExecuteElementsCheckApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        bitcoin_function,  // NOLINT
    std::function<ResponseStructType(const RequestStructType &)>
        elements_function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response;
  if (request.is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
    response = elements_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_ELEMENTS
  } else {
#ifndef CFD_DISABLE_BITCOIN
    response = bitcoin_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_BITCOIN
  }
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}